

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O1

bool __thiscall
uWS::HttpResponse<false>::internalEnd
          (HttpResponse<false> *this,string_view data,int totalSize,bool optional,
          bool allowContentLength)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  void *__buf;
  uint value;
  int __fd;
  ulong uVar6;
  bool bVar7;
  string_view status;
  string_view key;
  string_view value_00;
  
  uVar6 = data._M_len;
  status._M_str = "200 OK";
  status._M_len = 6;
  writeStatus(this,status);
  value = (uint)data._M_len;
  if (totalSize != 0) {
    value = totalSize;
  }
  lVar3 = us_socket_ext(0,this);
  if ((*(uint *)(lVar3 + 0xb4) & 2) == 0) {
    if ((*(uint *)(lVar3 + 0xb4) & 4) == 0) {
      key._M_str = "uWebSockets";
      key._M_len = 0xb;
      value_00._M_str = "17";
      value_00._M_len = 2;
      writeHeader(this,key,value_00);
      if (allowContentLength) {
        AsyncSocket<false>::write((AsyncSocket<false> *)this,0x152e59,(void *)0x10,0);
        writeUnsigned(this,value);
        __fd = 0x152e54;
        __buf = (void *)0x4;
      }
      else {
        __fd = 0x152e56;
        __buf = (void *)0x2;
      }
      AsyncSocket<false>::write((AsyncSocket<false> *)this,__fd,__buf,0);
      *(byte *)(lVar3 + 0xb4) = *(byte *)(lVar3 + 0xb4) | 4;
    }
    uVar4 = AsyncSocket<false>::write
                      ((AsyncSocket<false> *)this,(int)data._M_str,(void *)(uVar6 & 0xffffffff),
                       (ulong)optional);
    uVar5 = *(int *)(lVar3 + 0xb0) + (int)uVar4;
    *(uint *)(lVar3 + 0xb0) = uVar5;
    bVar1 = (uVar4 & 0x100000000) == 0;
    bVar2 = (uVar4 & 0xffffffff) == uVar6;
    bVar7 = bVar1 && bVar2;
    if ((!bVar1 || !bVar2) || uVar5 == value) {
      us_socket_timeout(0,this,10);
    }
    if (*(uint *)(lVar3 + 0xb0) == value) {
      (**(code **)(lVar3 + 0x80))(lVar3 + 0x80,2,lVar3 + 0x70,0x10,0,0);
      (**(code **)(lVar3 + 0x60))(lVar3 + 0x60,2,lVar3 + 0x50,0x10,0,0);
      *(byte *)(lVar3 + 0xb4) = *(byte *)(lVar3 + 0xb4) & 0xf7;
    }
  }
  else {
    if (uVar6 != 0) {
      AsyncSocket<false>::write((AsyncSocket<false> *)this,0x152e56,(void *)0x2,0);
      writeUnsignedHex(this,(uint)data._M_len);
      AsyncSocket<false>::write((AsyncSocket<false> *)this,0x152e56,(void *)0x2,0);
      AsyncSocket<false>::write
                ((AsyncSocket<false> *)this,(int)data._M_str,(void *)(uVar6 & 0xffffffff),0);
    }
    AsyncSocket<false>::write((AsyncSocket<false> *)this,0x152e51,(void *)0x7,0);
    (**(code **)(lVar3 + 0x80))(lVar3 + 0x80,2,lVar3 + 0x70,0x10,0,0);
    (**(code **)(lVar3 + 0x60))(lVar3 + 0x60,2,lVar3 + 0x50,0x10,0,0);
    *(byte *)(lVar3 + 0xb4) = *(byte *)(lVar3 + 0xb4) & 0xf7;
    us_socket_timeout(0,this,10);
    bVar7 = true;
  }
  return bVar7;
}

Assistant:

bool internalEnd(std::string_view data, int totalSize, bool optional, bool allowContentLength = true) {
        /* Write status if not already done */
        writeStatus(HTTP_200_OK);

        /* If no total size given then assume this chunk is everything */
        if (!totalSize) {
            totalSize = (int) data.length();
        }

        HttpResponseData<SSL> *httpResponseData = getHttpResponseData();
        if (httpResponseData->state & HttpResponseData<SSL>::HTTP_WRITE_CALLED) {

            /* We do not have tryWrite-like functionalities, so ignore optional in this path */

            /* Do not allow sending 0 chunk here */
            if (data.length()) {
                Super::write("\r\n", 2);
                writeUnsignedHex((unsigned int) data.length());
                Super::write("\r\n", 2);

                /* Ignoring optional for now */
                Super::write(data.data(), (int) data.length());
            }

            /* Terminating 0 chunk */
            Super::write("\r\n0\r\n\r\n", 7);

            markDone(httpResponseData);

            /* tryEnd can never fail when in chunked mode, since we do not have tryWrite (yet), only write */
            Super::timeout(HTTP_TIMEOUT_S);
            return true;
        } else {
            /* Write content-length on first call */
            if (!(httpResponseData->state & HttpResponseData<SSL>::HTTP_END_CALLED)) {
                /* Write mark, this propagates to WebSockets too */
                writeMark();

                /* WebSocket upgrades does not allow content-length */
                if (allowContentLength) {
                    /* Even zero is a valid content-length */
                    Super::write("Content-Length: ", 16);
                    writeUnsigned(totalSize);
                    Super::write("\r\n\r\n", 4);
                } else {
                    Super::write("\r\n", 2);
                }

                /* Mark end called */
                httpResponseData->state |= HttpResponseData<SSL>::HTTP_END_CALLED;
            }

            /* Even if we supply no new data to write, its failed boolean is useful to know
             * if it failed to drain any prior failed header writes */

            /* Write as much as possible without causing backpressure */
            auto [written, failed] = Super::write(data.data(), (int) data.length(), optional);
            httpResponseData->offset += written;

            /* Success is when we wrote the entire thing without any failures */
            bool success = (unsigned int) written == data.length() && !failed;

            /* If we are now at the end, start a timeout. Also start a timeout if we failed. */
            if (!success || httpResponseData->offset == totalSize) {
                Super::timeout(HTTP_TIMEOUT_S);
            }

            /* Remove onAborted function if we reach the end */
            if (httpResponseData->offset == totalSize) {
                markDone(httpResponseData);
            }

            return success;
        }
    }